

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O1

string __thiscall mjs::error_object::to_string(error_object *this)

{
  gc_heap *h;
  uint *puVar1;
  wostream *pwVar2;
  undefined8 extraout_RDX;
  undefined8 *in_RSI;
  string sVar3;
  wostringstream woss;
  gc_heap *local_218;
  undefined1 local_210 [32];
  gc_heap_ptr_untyped local_1f0;
  gc_heap_ptr_untyped local_1e0;
  double local_1d0;
  anon_union_32_5_7b1e0779_for_value_3 local_1c8;
  undefined8 local_1a8;
  wchar_t *local_1a0;
  wostringstream local_198 [112];
  ios_base local_128 [264];
  
  h = (gc_heap *)in_RSI[1];
  std::__cxx11::wostringstream::wostringstream(local_198);
  value_representation::get_value
            ((value *)&local_218,(value_representation *)(in_RSI + 5),(gc_heap *)in_RSI[1]);
  mjs::to_string((mjs *)&local_1e0,h,(value *)&local_218);
  puVar1 = (uint *)gc_heap_ptr_untyped::get(&local_1e0);
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     ((wostream *)local_198,(wchar_t *)(puVar1 + 1),(ulong)*puVar1);
  pwVar2 = std::operator<<(pwVar2,": ");
  local_1a8 = 7;
  local_1a0 = L"message";
  (**(code **)*in_RSI)(&local_1d0);
  mjs::to_string((mjs *)&local_1f0,h,(value *)&local_1d0);
  puVar1 = (uint *)gc_heap_ptr_untyped::get(&local_1f0);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
            (pwVar2,(wchar_t *)(puVar1 + 1),(ulong)*puVar1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1f0);
  value::destroy((value *)&local_1d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1e0);
  value::destroy((value *)&local_218);
  std::__cxx11::wstringbuf::str();
  local_1d0 = (double)local_210._0_8_;
  local_1c8.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_218;
  string::string((string *)this,h,(wstring_view *)&local_1d0);
  if (local_218 != (gc_heap *)(local_210 + 8)) {
    operator_delete(local_218,local_210._8_8_ * 4 + 4);
  }
  std::__cxx11::wostringstream::~wostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string to_string() const {
        auto& h = heap();
        std::wostringstream woss;
        woss << mjs::to_string(h, get_name()).view() << ": " << mjs::to_string(h, get(L"message")).view();
        return string{h, woss.str()};
    }